

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

void __thiscall Text::Text(Text *this,u16string *content)

{
  size_type sVar1;
  ulong uVar2;
  initializer_list<unsigned_int> __l;
  allocator_type local_31;
  uint local_30 [2];
  
  std::__cxx11::u16string::u16string(&this->content,content);
  local_30[1] = 0;
  __l._M_len = 1;
  __l._M_array = local_30 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,&local_31);
  sVar1 = (this->content)._M_string_length;
  uVar2 = 0;
  while (uVar2 != (uint)sVar1) {
    if ((this->content)._M_dataplus._M_p[uVar2] == L'\n') {
      uVar2 = uVar2 + 1;
      local_30[0] = (uint)uVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->line_offsets,local_30);
    }
    else {
      uVar2 = uVar2 + 1;
    }
  }
  return;
}

Assistant:

Text::Text(u16string &&content) : content{move(content)}, line_offsets{0} {
  for (uint32_t offset = 0, size = this->content.size(); offset < size; offset++) {
    if (this->content[offset] == '\n') {
      line_offsets.push_back(offset + 1);
    }
  }
}